

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O3

int mbedtls_dhm_read_params(mbedtls_dhm_context *ctx,uchar **p,uchar *end)

{
  mbedtls_mpi *X;
  int iVar1;
  size_t sVar2;
  
  X = &ctx->P;
  iVar1 = dhm_read_bignum(X,p,end);
  if (iVar1 == 0) {
    iVar1 = dhm_read_bignum(&ctx->G,p,end);
    if (iVar1 == 0) {
      iVar1 = dhm_read_bignum(&ctx->GY,p,end);
      if (iVar1 == 0) {
        iVar1 = dhm_check_range(&ctx->GY,X);
        if (iVar1 == 0) {
          sVar2 = mbedtls_mpi_size(X);
          ctx->len = sVar2;
          iVar1 = 0;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_dhm_read_params( mbedtls_dhm_context *ctx,
                     unsigned char **p,
                     const unsigned char *end )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    DHM_VALIDATE_RET( ctx != NULL );
    DHM_VALIDATE_RET( p != NULL && *p != NULL );
    DHM_VALIDATE_RET( end != NULL );

    if( ( ret = dhm_read_bignum( &ctx->P,  p, end ) ) != 0 ||
        ( ret = dhm_read_bignum( &ctx->G,  p, end ) ) != 0 ||
        ( ret = dhm_read_bignum( &ctx->GY, p, end ) ) != 0 )
        return( ret );

    if( ( ret = dhm_check_range( &ctx->GY, &ctx->P ) ) != 0 )
        return( ret );

    ctx->len = mbedtls_mpi_size( &ctx->P );

    return( 0 );
}